

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

void cuddRehash(DdManager *unique,int i)

{
  uint *puVar1;
  int *piVar2;
  double dVar3;
  DdNode *pDVar4;
  ulong uVar5;
  ulong uVar6;
  DdManager *pDVar7;
  DdSubtable *pDVar8;
  DdNode **ppDVar9;
  DdNode **ppDVar10;
  DdManager *pDVar11;
  DdNode **ppDVar12;
  DdNode **ppDVar13;
  DdNode *pDVar14;
  _func_void_long *p_Var15;
  int iVar16;
  DdNode **ppDVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  DdNode **ppDVar22;
  uint uVar23;
  DdNode **__ptr;
  
  dVar3 = unique->gcFrac;
  if (((dVar3 != 4.0) || (NAN(dVar3))) || (unique->slots <= unique->looseUpTo)) {
    if ((dVar3 == 0.2) && (!NAN(dVar3))) goto LAB_008111db;
  }
  else {
    unique->gcFrac = 1.0;
    unique->minDead = unique->slots;
  }
  if (unique->maxmem < unique->memused) {
    unique->gcFrac = 0.2;
    unique->minDead = (uint)(long)((double)unique->slots * 0.2);
    cuddShrinkDeathRow(unique);
    iVar16 = cuddGarbageCollect(unique,1);
    if (0 < iVar16) {
      return;
    }
  }
LAB_008111db:
  p_Var15 = Extra_UtilMMoutOfMemory;
  if (i == 0x7fffffff) {
    uVar19 = (unique->constants).slots;
    iVar16 = (unique->constants).shift;
    __ptr = (unique->constants).nodelist;
    uVar23 = uVar19 * 2;
    ppDVar17 = (DdNode **)malloc((ulong)uVar23 * 8);
    if (ppDVar17 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var15;
      fwrite("Unable to resize constant subtable for lack of memory\n",0x36,1,(FILE *)unique->err);
      cuddGarbageCollect(unique,1);
      iVar16 = unique->size;
      if (0 < (long)iVar16) {
        pDVar8 = unique->subtables;
        lVar20 = 0;
        do {
          piVar2 = (int *)((long)&pDVar8->maxKeys + lVar20);
          *piVar2 = *piVar2 << 1;
          lVar20 = lVar20 + 0x38;
        } while ((long)iVar16 * 0x38 - lVar20 != 0);
      }
      puVar1 = &(unique->constants).maxKeys;
      *puVar1 = *puVar1 << 1;
      return;
    }
    iVar16 = iVar16 + -1;
    Extra_UtilMMoutOfMemory = p_Var15;
    (unique->constants).slots = uVar23;
    (unique->constants).shift = iVar16;
    (unique->constants).maxKeys = uVar19 * 8;
    (unique->constants).nodelist = ppDVar17;
    if (uVar23 != 0) {
      memset(ppDVar17,0,(ulong)uVar23 * 8);
    }
    if (uVar19 != 0) {
      uVar18 = 0;
      do {
        pDVar14 = __ptr[uVar18];
        while (pDVar14 != (DdNode *)0x0) {
          uVar21 = (uint)(((int)((ulong)*(undefined8 *)&pDVar14->type >> 0x20) +
                          (int)*(undefined8 *)&pDVar14->type * 0xc00005) * 0x40f1f9) >>
                   ((byte)iVar16 & 0x1f);
          pDVar4 = pDVar14->next;
          pDVar14->next = ppDVar17[(int)uVar21];
          ppDVar17[(int)uVar21] = pDVar14;
          pDVar14 = pDVar4;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar19);
    }
  }
  else {
    pDVar8 = unique->subtables;
    uVar19 = pDVar8[i].slots;
    iVar16 = pDVar8[i].shift;
    __ptr = pDVar8[i].nodelist;
    uVar23 = uVar19 * 2;
    ppDVar17 = (DdNode **)malloc((ulong)uVar23 * 8);
    if (ppDVar17 == (DdNode **)0x0) {
      Extra_UtilMMoutOfMemory = p_Var15;
      fprintf((FILE *)unique->err,"Unable to resize subtable %d for lack of memory\n",(ulong)(uint)i
             );
      cuddGarbageCollect(unique,1);
      if (unique->stash == (char *)0x0) {
        return;
      }
      free(unique->stash);
      unique->stash = (char *)0x0;
      cuddSlowTableGrowth(unique);
      return;
    }
    iVar16 = iVar16 + -1;
    Extra_UtilMMoutOfMemory = p_Var15;
    pDVar8[i].nodelist = ppDVar17;
    pDVar8[i].slots = uVar23;
    pDVar8[i].shift = iVar16;
    pDVar8[i].maxKeys = uVar19 * 8;
    if (uVar19 != 0) {
      uVar18 = 0;
      do {
        pDVar11 = (DdManager *)__ptr[uVar18];
        ppDVar12 = (DdNode **)(((long)(uVar18 << 0x21) >> 0x1d) + (long)ppDVar17);
        ppDVar13 = ppDVar17 + ((int)uVar18 * 2 + 1);
        while (pDVar11 != unique) {
          ppDVar10 = &(pDVar11->sentinel).next;
          uVar5 = *(ulong *)&(pDVar11->sentinel).type;
          uVar6 = *(ulong *)((long)&(pDVar11->sentinel).type + 8);
          ppDVar22 = ppDVar13;
          ppDVar9 = ppDVar12;
          if (((((uint)uVar6 & 1) + *(int *)((uVar6 & 0xfffffffffffffffe) + 0x20) * 2 +
               (((uint)uVar5 & 1) + *(int *)((uVar5 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
               0x40f1f9 & 1 << ((byte)iVar16 & 0x1f)) != 0) {
            ppDVar22 = ppDVar10;
            ppDVar9 = ppDVar13;
            ppDVar10 = ppDVar12;
          }
          pDVar7 = (DdManager *)(pDVar11->sentinel).next;
          *ppDVar9 = &pDVar11->sentinel;
          pDVar11 = pDVar7;
          ppDVar12 = ppDVar10;
          ppDVar13 = ppDVar22;
        }
        *ppDVar13 = &unique->sentinel;
        *ppDVar12 = &unique->sentinel;
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar19);
    }
  }
  if (__ptr != (DdNode **)0x0) {
    free(__ptr);
  }
  unique->memused = unique->memused + (ulong)(uVar23 - uVar19) * 8;
  uVar23 = (uVar23 - uVar19) + unique->slots;
  unique->slots = uVar23;
  unique->minDead = (uint)(long)((double)uVar23 * unique->gcFrac);
  uVar19 = unique->maxCacheHard;
  if (uVar23 * 4 < unique->maxCacheHard) {
    uVar19 = uVar23 * 4;
  }
  iVar16 = uVar19 + unique->cacheSlots * -2;
  unique->cacheSlack = iVar16;
  if (iVar16 < 0 || uVar23 >> 1 <= unique->cacheSlots) {
    return;
  }
  cuddCacheResize(unique);
  return;
}

Assistant:

void
cuddRehash(
  DdManager * unique,
  int i)
{
    unsigned int slots, oldslots;
    int shift, oldshift;
    int j, pos;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    DdNode *sentinel = &(unique->sentinel);
    hack split;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (unique->gcFrac == DD_GC_FRAC_HI && unique->slots > unique->looseUpTo) {
        unique->gcFrac = DD_GC_FRAC_LO;
        unique->minDead = (unsigned) (DD_GC_FRAC_LO * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_LO);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
    }

    if (unique->gcFrac != DD_GC_FRAC_MIN && unique->memused > unique->maxmem) {
        unique->gcFrac = DD_GC_FRAC_MIN;
        unique->minDead = (unsigned) (DD_GC_FRAC_MIN * (double) unique->slots);
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,"GC fraction = %.2f\t", DD_GC_FRAC_MIN);
        (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
#endif
        cuddShrinkDeathRow(unique);
        if (cuddGarbageCollect(unique,1) > 0) return;
    }

    if (i != CUDD_CONST_INDEX) {
        oldslots = unique->subtables[i].slots;
        oldshift = unique->subtables[i].shift;
        oldnodelist = unique->subtables[i].nodelist;

        /* Compute the new size of the subtable. */
        slots = oldslots << 1;
        shift = oldshift - 1;

        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize subtable %d for lack of memory\n",
                           i);
            /* Prevent frequent resizing attempts. */
            (void) cuddGarbageCollect(unique,1);
            if (unique->stash != NULL) {
                ABC_FREE(unique->stash);
                unique->stash = NULL;
                /* Inhibit resizing of tables. */
                cuddSlowTableGrowth(unique);
            }
            return;
        }
        unique->subtables[i].nodelist = nodelist;
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;

        /* Move the nodes from the old table to the new table.
        ** This code depends on the type of hash function.
        ** It assumes that the effect of doubling the size of the table
        ** is to retain one more bit of the 32-bit hash value.
        ** The additional bit is the LSB. */
        for (j = 0; (unsigned) j < oldslots; j++) {
            DdNodePtr *evenP, *oddP;
            node = oldnodelist[j];
            evenP = &(nodelist[j<<1]);
            oddP = &(nodelist[(j<<1)+1]);
            while (node != sentinel) {
                next = node->next;
                pos = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
                if (pos & 1) {
                    *oddP = node;
                    oddP = &(node->next);
                } else {
                    *evenP = node;
                    evenP = &(node->next);
                }
                node = next;
            }
            *evenP = *oddP = sentinel;
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing layer %d: keys %d dead %d new size %d\n",
                       i, unique->subtables[i].keys,
                       unique->subtables[i].dead, slots);
#endif
    } else {
        oldslots = unique->constants.slots;
        oldshift = unique->constants.shift;
        oldnodelist = unique->constants.nodelist;

        /* The constant subtable is never subjected to reordering.
        ** Therefore, when it is resized, it is because it has just
        ** reached the maximum load. We can safely just double the size,
        ** with no need for the loop we use for the other tables.
        */
        slots = oldslots << 1;
        shift = oldshift - 1;
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            (void) fprintf(unique->err,
                           "Unable to resize constant subtable for lack of memory\n");
            (void) cuddGarbageCollect(unique,1);
            for (j = 0; j < unique->size; j++) {
                unique->subtables[j].maxKeys <<= 1;
            }
            unique->constants.maxKeys <<= 1;
            return;
        }
        unique->constants.slots = slots;
        unique->constants.shift = shift;
        unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->constants.nodelist = nodelist;
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        for (j = 0; (unsigned) j < oldslots; j++) {
            node = oldnodelist[j];
            while (node != NULL) {
                next = node->next;
                split.value = cuddV(node);
                pos = ddHash(split.bits[0], split.bits[1], shift);
                node->next = nodelist[pos];
                nodelist[pos] = node;
                node = next;
            }
        }
        ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "rehashing constants: keys %d dead %d new size %d\n",
                       unique->constants.keys,unique->constants.dead,slots);
#endif
    }

    /* Update global data */

    unique->memused += (slots - oldslots) * sizeof(DdNodePtr);
    unique->slots += (slots - oldslots);
    ddFixLimits(unique);

}